

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O0

slReturn nmeaBaudRateSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  errInfo error;
  errInfo error_00;
  _Bool _Var1;
  char cVar2;
  int iVar3;
  uint uVar4;
  longlong lVar5;
  void *pvVar6;
  slReturn pvVar7;
  long lVar8;
  int ck;
  int ln;
  int un;
  char c;
  char *local_78;
  char *local_70;
  uint32_t local_68;
  undefined4 uStack_64;
  slReturn local_60;
  slReturn rscResp;
  char *local_50;
  char *local_48;
  uint32_t local_40;
  undefined4 uStack_3c;
  slReturn local_38;
  slReturn frResp;
  longlong start;
  char local_20;
  char local_1f;
  char local_1e;
  byte local_1d;
  int cksm;
  char last [3];
  _Bool inLine;
  int verbosity_local;
  int maxTimeMs_local;
  int fdPort_local;
  
  local_1d = 0;
  start._4_4_ = 0;
  cksm = verbosity;
  _last = maxTimeMs;
  frResp = (slReturn)currentTimeMs();
  local_38 = flushRx(fdPort);
  _Var1 = isErrorReturn(local_38);
  if (_Var1) {
    createErrorInfo((errorInfo_slReturn *)&rscResp,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"nmeaBaudRateSynchronizer",0x7b,local_38);
    error.fileName = local_50;
    error.cause = rscResp;
    error.functionName = local_48;
    error.lineNumber = local_40;
    error._28_4_ = uStack_3c;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  while( true ) {
    lVar5 = currentTimeMs();
    pvVar7 = frResp;
    if ((long)frResp + (long)_last <= lVar5) {
      pvVar7 = makeOkInfoReturn((void *)0x0);
      return pvVar7;
    }
    lVar8 = (long)_last;
    lVar5 = currentTimeMs();
    local_60 = readSerialChar(fdPort,(long)pvVar7 + (lVar8 - lVar5));
    _Var1 = isErrorReturn(local_60);
    if (_Var1) break;
    _Var1 = isWarningReturn(local_60);
    if (_Var1) {
      pvVar7 = makeOkInfoReturn((void *)0x0);
      return pvVar7;
    }
    pvVar6 = getReturnInfo(local_60);
    cVar2 = (char)pvVar6;
    if ((local_1d & 1) == 0) {
      if (cVar2 == '$') {
        local_1d = 1;
        start._4_4_ = 0;
      }
    }
    else if ((cVar2 == '\r') || (cVar2 == '\n')) {
      if ((local_20 == '*') &&
         (((iVar3 = hex2int(local_1f), -1 < iVar3 && (uVar4 = hex2int(local_1e), -1 < (int)uVar4))
          && (start._4_4_ = (int)local_1e ^ (int)local_1f ^ (int)local_20 ^ start._4_4_,
             (iVar3 << 4 | uVar4) == start._4_4_)))) {
        pvVar7 = makeOkInfoReturn((void *)0x1);
        return pvVar7;
      }
      local_1d = 0;
    }
    else {
      start._4_4_ = (int)cVar2 ^ start._4_4_;
      local_20 = local_1f;
      local_1f = local_1e;
      local_1e = cVar2;
    }
  }
  createErrorInfo((errorInfo_slReturn *)&un,
                  "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c",
                  "nmeaBaudRateSynchronizer",0x82,local_60);
  error_00.fileName = local_78;
  error_00.cause = _un;
  error_00.functionName = local_70;
  error_00.lineNumber = local_68;
  error_00._28_4_ = uStack_64;
  pvVar7 = makeErrorMsgReturn(error_00,"problem reading a character while synchronizing");
  return pvVar7;
}

Assistant:

static slReturn nmeaBaudRateSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    bool inLine = false;
    char last[3];
    int cksm = 0;
    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        slReturn rscResp = readSerialChar(fdPort, start + maxTimeMs - currentTimeMs());
        if (isErrorReturn(rscResp))
            return makeErrorMsgReturn(ERR_CAUSE(rscResp), "problem reading a character while synchronizing");
        if (isWarningReturn(rscResp))
            return makeOkInfoReturn(bool2info(false));

        char c = getReturnInfoChar(rscResp);
        if (inLine) {
            if ((c == '\r') || (c == '\n')) {
                if (last[0] == '*') {
                    int un = hex2int(last[1]);
                    if (un >= 0) {
                        int ln = hex2int(last[2]);
                        if (ln >= 0) {
                            int ck = (un << 4) | ln;

                            // correct checksum for the last three characters received...
                            cksm ^= last[0];
                            cksm ^= last[1];
                            cksm ^= last[2];

                            if (ck == cksm) {
                                return makeOkInfoReturn(bool2info(true));
                            }
                        }
                    }
                }
                inLine = false;
            }
            else {
                cksm ^= c;
                last[0] = last[1];
                last[1] = last[2];
                last[2] = c;
            }
        }
        else if (c == '$') {
            inLine = true;
            cksm = 0;
        }
    }
    return makeOkInfoReturn(bool2info(false));
}